

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool,false,false>
               (string_t *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  unsigned_long *puVar5;
  ulong uVar6;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  idx_t iVar23;
  ulong uVar24;
  char **ppcVar25;
  ulong uVar26;
  string_t input;
  string_t input_00;
  string_t input_01;
  char **local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(ldata->value).pointer.ptr;
      iVar23 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_70 + -1);
        uVar4 = paVar1->length;
        uVar9 = paVar1->prefix[0];
        uVar12 = paVar1->prefix[1];
        uVar15 = paVar1->prefix[2];
        uVar18 = paVar1->prefix[3];
        input_01.value.pointer.prefix[3] = uVar18;
        input_01.value.pointer.prefix[2] = uVar15;
        input_01.value.pointer.prefix[1] = uVar12;
        input_01.value.pointer.prefix[0] = uVar9;
        input_01.value.pointer.length = uVar4;
        input_01.value.pointer.ptr = *local_70;
        iVar19 = GetBitOperator::Operation<duckdb::string_t,int,int>(input_01,rdata[iVar23]);
        result_data[iVar23] = iVar19;
        iVar23 = iVar23 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar23);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar20 = 0;
    uVar24 = 0;
    do {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar21 = uVar24 + 0x40;
        if (count <= uVar24 + 0x40) {
          uVar21 = count;
        }
LAB_00ebfd70:
        uVar22 = uVar24;
        if (uVar24 < uVar21) {
          ppcVar25 = &ldata[uVar24].value.pointer.ptr;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar25 + -1);
            uVar2 = paVar1->length;
            uVar7 = paVar1->prefix[0];
            uVar10 = paVar1->prefix[1];
            uVar13 = paVar1->prefix[2];
            uVar16 = paVar1->prefix[3];
            input.value.pointer.prefix[3] = uVar16;
            input.value.pointer.prefix[2] = uVar13;
            input.value.pointer.prefix[1] = uVar10;
            input.value.pointer.prefix[0] = uVar7;
            input.value.pointer.length = uVar2;
            input.value.pointer.ptr = *ppcVar25;
            iVar19 = GetBitOperator::Operation<duckdb::string_t,int,int>(input,rdata[uVar24]);
            result_data[uVar24] = iVar19;
            uVar24 = uVar24 + 1;
            ppcVar25 = ppcVar25 + 2;
            uVar22 = uVar21;
          } while (uVar21 != uVar24);
        }
      }
      else {
        uVar6 = puVar5[uVar20];
        uVar21 = uVar24 + 0x40;
        if (count <= uVar24 + 0x40) {
          uVar21 = count;
        }
        uVar22 = uVar21;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) goto LAB_00ebfd70;
          uVar22 = uVar24;
          if (uVar24 < uVar21) {
            ppcVar25 = &ldata[uVar24].value.pointer.ptr;
            uVar26 = 0;
            do {
              if ((uVar6 >> (uVar26 & 0x3f) & 1) != 0) {
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar25 + -1);
                uVar3 = paVar1->length;
                uVar8 = paVar1->prefix[0];
                uVar11 = paVar1->prefix[1];
                uVar14 = paVar1->prefix[2];
                uVar17 = paVar1->prefix[3];
                input_00.value.pointer.prefix[3] = uVar17;
                input_00.value.pointer.prefix[2] = uVar14;
                input_00.value.pointer.prefix[1] = uVar11;
                input_00.value.pointer.prefix[0] = uVar8;
                input_00.value.pointer.length = uVar3;
                input_00.value.pointer.ptr = *ppcVar25;
                iVar19 = GetBitOperator::Operation<duckdb::string_t,int,int>
                                   (input_00,rdata[uVar24 + uVar26]);
                result_data[uVar24 + uVar26] = iVar19;
              }
              uVar26 = uVar26 + 1;
              ppcVar25 = ppcVar25 + 2;
              uVar22 = uVar21;
            } while (uVar21 - uVar24 != uVar26);
          }
        }
      }
      uVar20 = uVar20 + 1;
      uVar24 = uVar22;
    } while (uVar20 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}